

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

Fl_Widget * __thiscall
Fl_File_Browser_Type::widget(Fl_File_Browser_Type *this,int x,int y,int w,int h)

{
  Fl_File_Browser *this_00;
  
  this_00 = (Fl_File_Browser *)operator_new(0x2b8);
  Fl_File_Browser::Fl_File_Browser(this_00,x,y,w,h,(char *)0x0);
  if (batch_mode == 0) {
    Fl_File_Browser::load(this_00,".",fl_numericsort);
  }
  return (Fl_Widget *)this_00;
}

Assistant:

Fl_Widget *widget(int x,int y,int w,int h) {
    Fl_File_Browser* b = new Fl_File_Browser(x,y,w,h);
    // Fl_File_Browser::add calls fl_height(), which requires the X display open.
    // Avoid this when compiling so it works w/o a display:
    if (!batch_mode) {
      b->load(".");
    }
    return b;
  }